

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

JumpAnnotation * __thiscall asmjit::_abi_1_10::BaseCompiler::newJumpAnnotation(BaseCompiler *this)

{
  Error EVar1;
  size_type sVar2;
  ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*> *in_RDI;
  JumpAnnotation *jumpAnnotation;
  uint32_t id;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  Error err;
  ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*> *pZVar3;
  BaseEmitter *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  BaseEmitter *local_8;
  
  err = (Error)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  EVar1 = ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*>::grow(in_RDI,in_stack_ffffffffffffffc8,0);
  if (EVar1 == 0) {
    sVar2 = ZoneVectorBase::size((ZoneVectorBase *)&in_RDI[0x1d].super_ZoneVectorBase._size);
    pZVar3 = in_RDI;
    local_8 = (BaseEmitter *)
              ZoneAllocator::
              newT<asmjit::_abi_1_10::JumpAnnotation,asmjit::_abi_1_10::BaseCompiler*,unsigned_int&>
                        ((ZoneAllocator *)CONCAT44(sVar2,in_stack_ffffffffffffffe8),
                         (BaseCompiler **)in_stack_ffffffffffffffe0,(uint *)in_RDI);
    EVar1 = (Error)((ulong)pZVar3 >> 0x20);
    if (local_8 == (BaseEmitter *)0x0) {
      DebugUtils::errored(1);
      BaseEmitter::reportError(local_8,EVar1,(char *)in_RDI);
      local_8 = (BaseEmitter *)0x0;
    }
    else {
      ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*>::appendUnsafe
                (in_RDI,(JumpAnnotation **)in_stack_ffffffffffffffc8);
    }
  }
  else {
    DebugUtils::errored(1);
    BaseEmitter::reportError(in_stack_ffffffffffffffe0,err,(char *)in_RDI);
    local_8 = (BaseEmitter *)0x0;
  }
  return (JumpAnnotation *)local_8;
}

Assistant:

JumpAnnotation* BaseCompiler::newJumpAnnotation() {
  if (_jumpAnnotations.grow(&_allocator, 1) != kErrorOk) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  uint32_t id = _jumpAnnotations.size();
  JumpAnnotation* jumpAnnotation = _allocator.newT<JumpAnnotation>(this, id);

  if (!jumpAnnotation) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  _jumpAnnotations.appendUnsafe(jumpAnnotation);
  return jumpAnnotation;
}